

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strategy.cpp
# Opt level: O1

void __thiscall Strategy::Strategy(Strategy *this,StrategyConfig *config)

{
  CFGsContainer **ppCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *__s;
  char cVar4;
  size_t sVar5;
  CFGsContainer *pCVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  allocator local_99;
  ofstream *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  this->_vptr_Strategy = (_func_int **)&PTR__Strategy_00117d28;
  StrategyConfig::StrategyConfig(&this->m_config,config);
  local_98 = &this->m_fout;
  this->m_a = (CFGsContainer *)0x0;
  this->m_b = (CFGsContainer *)0x0;
  std::ofstream::ofstream(local_98);
  __s = config->instrs;
  if (__s != (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar5);
    Instruction::load(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  pCVar6 = (CFGsContainer *)operator_new(0x298);
  std::__cxx11::string::string((string *)&local_90,config->input1,&local_99);
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"A","");
  CFGsContainer::CFGsContainer(pCVar6,&local_90,&local_70);
  ppCVar1 = &this->m_a;
  *ppCVar1 = pCVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  paVar3 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pCVar6 = (CFGsContainer *)operator_new(0x298);
  std::__cxx11::string::string((string *)&local_90,config->input2,&local_99);
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"B","");
  CFGsContainer::CFGsContainer(pCVar6,&local_90,&local_70);
  this->m_b = pCVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (config->compress == true) {
    CFGsContainer::compressAll(*ppCVar1);
    CFGsContainer::compressAll(this->m_b);
  }
  CFGsContainer::checkAll(*ppCVar1);
  CFGsContainer::checkAll(this->m_b);
  if (config->dump != (char *)0x0) {
    CFGsContainer::dumpAll(*ppCVar1,config->dump);
    CFGsContainer::dumpAll(this->m_b,config->dump);
  }
  if (config->output != (char *)0x0) {
    std::ofstream::open((char *)local_98,(_Ios_Openmode)config->output);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      local_90._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Unable to open output file: ","");
      std::operator+(__return_storage_ptr__,&local_90,config->output);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

Strategy::Strategy(const StrategyConfig& config) : m_config(config), m_a(0), m_b(0) {
	if (config.instrs)
		Instruction::load(std::string(config.instrs));

	m_a = new CFGsContainer((std::string(config.input1)), "A");
	m_b = new CFGsContainer((std::string(config.input2)), "B");

	if (config.compress) {
		m_a->compressAll();
		m_b->compressAll();
	}

	m_a->checkAll();
	m_b->checkAll();

	if (config.dump) {
		m_a->dumpAll(config.dump);
		m_b->dumpAll(config.dump);
	}

	if (config.output) {
		m_fout.open(config.output);
		if (!m_fout.is_open())
			throw std::string("Unable to open output file: ") + config.output;
	}
}